

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFilePostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmValue cVar2;
  string configProp;
  string frameworkPostfix;
  string local_e0;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_e0,config);
    local_80.View_._M_len = local_e0._M_string_length;
    local_80.View_._M_str = local_e0._M_dataplus._M_p;
    local_50.View_._M_len = 8;
    local_50.View_._M_str = "_POSTFIX";
    cmStrCat<>(&local_c0,&local_80,&local_50);
    std::__cxx11::string::~string((string *)&local_e0);
    cVar2 = GetProperty(this,&local_c0);
    bVar1 = IsImported(this);
    if (!bVar1) {
      if (cVar2.Value != (string *)0x0) {
        bVar1 = IsAppBundleOnApple(this);
        if (!bVar1) {
          bVar1 = IsFrameworkOnApple(this);
          if (!bVar1) goto LAB_002c9cc8;
        }
      }
      cVar2.Value = (string *)0x0;
    }
LAB_002c9cc8:
    GetFrameworkMultiConfigPostfix((string *)&local_80,this,config);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (local_a0._M_string_length != 0) {
      cVar2.Value = &local_a0;
    }
    std::__cxx11::string::~string((string *)&local_c0);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar2.Value);
      goto LAB_002c9d2a;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_002c9d2a:
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string& Evaluate(cmLocalGenerator* lg, const std::string& config,
                              cmGeneratorTarget const* headTarget,
                              cmGeneratorExpressionDAGChecker* dagChecker,
                              std::string const& /*lang*/) const override
  {
    std::map<std::string, std::vector<std::string>> filesPerDir;
    this->FileSet->EvaluateFileEntry(this->BaseDirs, filesPerDir,
                                     this->EntryCge, lg, config, headTarget,
                                     dagChecker);

    std::vector<std::string> files;
    for (auto const& it : filesPerDir) {
      files.insert(files.end(), it.second.begin(), it.second.end());
    }

    static std::string filesStr;
    filesStr = cmJoin(files, ";");
    return filesStr;
  }